

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-file.c
# Opt level: O1

int lws_plat_read_file(char *filename,void *buf,size_t len)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  
  __fd = lws_open(filename,0);
  if (__fd == -1) {
    iVar1 = -1;
  }
  else {
    sVar2 = read(__fd,buf,len);
    iVar1 = (int)sVar2;
    close(__fd);
  }
  return iVar1;
}

Assistant:

int
lws_plat_read_file(const char *filename, void *buf, size_t len)
{
	int fd = lws_open(filename, O_RDONLY);
	ssize_t n;

	if (fd == -1)
		return -1;

	n = read(fd, buf, len);
	close(fd);

	return (int)n;
}